

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

bool __thiscall
Assimp::X3DImporter::PostprocessHelper_ElementIsMetadata(X3DImporter *this,EType pType)

{
  EType pType_local;
  X3DImporter *this_local;
  
  if ((((pType == ENET_MetaBoolean) || (pType == ENET_MetaDouble)) || (pType == ENET_MetaFloat)) ||
     (((pType == ENET_MetaInteger || (pType == ENET_MetaString)) || (pType == ENET_MetaSet)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool X3DImporter::PostprocessHelper_ElementIsMetadata(const CX3DImporter_NodeElement::EType pType) const
{
	if((pType == CX3DImporter_NodeElement::ENET_MetaBoolean) || (pType == CX3DImporter_NodeElement::ENET_MetaDouble) ||
		(pType == CX3DImporter_NodeElement::ENET_MetaFloat) || (pType == CX3DImporter_NodeElement::ENET_MetaInteger) ||
		(pType == CX3DImporter_NodeElement::ENET_MetaString) || (pType == CX3DImporter_NodeElement::ENET_MetaSet))
	{
		return true;
	}
	else
	{
		return false;
	}
}